

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O2

void __thiscall
ylt::metric::metric_t::metric_t<3ul>
          (metric_t *this,MetricType type,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *labels_name)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string(&local_50,name);
  std::__cxx11::string::string(&local_70,help);
  metric_t(this,type,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x20) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->labels_name_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar1));
  }
  return;
}

Assistant:

metric_t(MetricType type, std::string name, std::string help,
           std::array<std::string, N> labels_name)
      : metric_t(type, std::move(name), std::move(help)) {
    for (size_t i = 0; i < N; i++) {
      labels_name_.push_back(std::move(labels_name[i]));
    }
  }